

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ir.c
# Opt level: O1

TRef lj_ir_kint(jit_State *J,int32_t k)

{
  IRIns *pIVar1;
  ushort uVar2;
  uint uVar3;
  ulong uVar4;
  
  uVar2 = J->chain[0x16];
  if (uVar2 != 0) {
    pIVar1 = (J->cur).ir;
    do {
      uVar3 = (uint)uVar2;
      if (pIVar1[uVar2].field_1.op12 == k) goto LAB_00128ece;
      uVar2 = *(ushort *)((long)pIVar1 + (ulong)uVar2 * 8 + 6);
    } while (uVar2 != 0);
  }
  uVar3 = (J->cur).nk;
  if (uVar3 <= J->irbotlim) {
    lj_ir_growbot(J);
  }
  uVar3 = uVar3 - 1;
  uVar4 = (ulong)uVar3;
  (J->cur).nk = uVar3;
  pIVar1 = (J->cur).ir;
  pIVar1[uVar4].i = k;
  *(undefined2 *)((long)pIVar1 + uVar4 * 8 + 4) = 0x1613;
  *(IRRef1 *)((long)pIVar1 + uVar4 * 8 + 6) = J->chain[0x16];
  J->chain[0x16] = (IRRef1)uVar3;
LAB_00128ece:
  return uVar3 + 0x13000000;
}

Assistant:

TRef LJ_FASTCALL lj_ir_kint(jit_State *J, int32_t k)
{
  IRIns *ir, *cir = J->cur.ir;
  IRRef ref;
  for (ref = J->chain[IR_KINT]; ref; ref = cir[ref].prev)
    if (cir[ref].i == k)
      goto found;
  ref = ir_nextk(J);
  ir = IR(ref);
  ir->i = k;
  ir->t.irt = IRT_INT;
  ir->o = IR_KINT;
  ir->prev = J->chain[IR_KINT];
  J->chain[IR_KINT] = (IRRef1)ref;
found:
  return TREF(ref, IRT_INT);
}